

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,char *source,char *destination,MatchProperties *match_properties)

{
  cmCommand *this_00;
  MatchProperties *pMVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  unsigned_long uVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  mode_t local_314;
  allocator local_2b9;
  string local_2b8 [8];
  string toPath;
  string local_290 [8];
  string fromPath;
  unsigned_long fileNum;
  unsigned_long numFiles;
  string local_258;
  Directory local_238;
  Directory dir;
  mode_t permissions_after;
  mode_t permissions_before;
  mode_t required_permissions;
  mode_t permissions;
  string local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream e;
  allocator local_51;
  string local_50;
  MatchProperties *local_30;
  MatchProperties *match_properties_local;
  char *destination_local;
  char *source_local;
  cmFileCopier *this_local;
  
  local_30 = match_properties;
  match_properties_local = (MatchProperties *)destination;
  destination_local = source;
  source_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,destination,&local_51);
  bVar2 = cmsys::SystemTools::FileIsDirectory(&local_50);
  (*this->_vptr_cmFileCopier[4])(this,destination,1,(ulong)((byte)~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar2 = cmsys::SystemTools::MakeDirectory(&match_properties_local->Exclude);
  if (bVar2) {
    if (local_30->Permissions == 0) {
      local_314 = this->DirPermissions;
    }
    else {
      local_314 = local_30->Permissions;
    }
    permissions_before = local_314;
    if (local_314 == 0) {
      cmsys::SystemTools::GetPermissions(destination_local,&permissions_before);
    }
    uVar3 = mode_owner_read | mode_owner_write | mode_owner_execute;
    dir.Internal._0_4_ = 0;
    if ((permissions_before & uVar3) == uVar3) {
      dir.Internal._4_4_ = permissions_before;
    }
    else {
      dir.Internal._4_4_ = permissions_before | uVar3;
      dir.Internal._0_4_ = permissions_before;
    }
    bVar2 = SetPermissions(this,&match_properties_local->Exclude,dir.Internal._4_4_);
    if (bVar2) {
      cmsys::Directory::Directory(&local_238);
      pcVar7 = destination_local;
      if ((destination_local != (char *)0x0) && (*destination_local != '\0')) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_258,pcVar7,(allocator *)((long)&numFiles + 7))
        ;
        cmsys::Directory::Load(&local_238,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator((allocator<char> *)((long)&numFiles + 7));
      }
      uVar6 = cmsys::Directory::GetNumberOfFiles(&local_238);
      for (fromPath.field_2._8_8_ = 0; (ulong)fromPath.field_2._8_8_ < uVar6;
          fromPath.field_2._8_8_ = fromPath.field_2._8_8_ + 1) {
        pcVar7 = cmsys::Directory::GetFile(&local_238,fromPath.field_2._8_8_);
        iVar4 = strcmp(pcVar7,".");
        if (iVar4 != 0) {
          pcVar7 = cmsys::Directory::GetFile(&local_238,fromPath.field_2._8_8_);
          iVar4 = strcmp(pcVar7,"..");
          pcVar7 = destination_local;
          if (iVar4 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_290,pcVar7,(allocator *)(toPath.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator((allocator<char> *)(toPath.field_2._M_local_buf + 0xf))
            ;
            std::__cxx11::string::operator+=(local_290,"/");
            pcVar7 = cmsys::Directory::GetFile(&local_238,fromPath.field_2._8_8_);
            std::__cxx11::string::operator+=(local_290,pcVar7);
            pMVar1 = match_properties_local;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2b8,&pMVar1->Exclude,&local_2b9);
            std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
            std::__cxx11::string::operator+=(local_2b8,"/");
            pcVar7 = cmsys::Directory::GetFile(&local_238,fromPath.field_2._8_8_);
            std::__cxx11::string::operator+=(local_2b8,pcVar7);
            uVar8 = std::__cxx11::string::c_str();
            uVar9 = std::__cxx11::string::c_str();
            uVar3 = (*this->_vptr_cmFileCopier[2])(this,uVar8,uVar9);
            bVar2 = (uVar3 & 1) == 0;
            if (bVar2) {
              this_local._7_1_ = 0;
            }
            std::__cxx11::string::~string(local_2b8);
            std::__cxx11::string::~string(local_290);
            if (bVar2) goto LAB_00587612;
          }
        }
      }
      this_local._7_1_ = SetPermissions(this,&match_properties_local->Exclude,(mode_t)dir.Internal);
LAB_00587612:
      cmsys::Directory::~Directory(&local_238);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar5 = std::operator<<((ostream *)local_1e0,this->Name);
    poVar5 = std::operator<<(poVar5," cannot make directory \"");
    poVar5 = std::operator<<(poVar5,&match_properties_local->Exclude);
    poVar5 = std::operator<<(poVar5,"\": ");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::operator<<(poVar5,local_200);
    std::__cxx11::string::~string(local_200);
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(this_00,(string *)&required_permissions);
    std::__cxx11::string::~string((string *)&required_permissions);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCopier::InstallDirectory(const char* source,
                                    const char* destination,
                                    MatchProperties const& match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !cmSystemTools::FileIsDirectory(destination));

  // Make sure the destination directory exists.
  if(!cmSystemTools::MakeDirectory(destination))
    {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination << "\": "
      << cmSystemTools::GetLastSystemError();
    this->FileCommand->SetError(e.str());
    return false;
    }

  // Compute the requested permissions for the destination directory.
  mode_t permissions = (match_properties.Permissions?
                        match_properties.Permissions : this->DirPermissions);
  if(!permissions)
    {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
    }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if((permissions & required_permissions) == required_permissions)
    {
    permissions_before = permissions;
    }
  else
    {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
    }

  // Set the required permissions of the destination directory.
  if(!this->SetPermissions(destination, permissions_before))
    {
    return false;
    }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if(source && *source)
    {
    dir.Load(source);
    }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for(unsigned long fileNum = 0; fileNum < numFiles; ++fileNum)
    {
    if(!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
         strcmp(dir.GetFile(fileNum), "..") == 0))
      {
      std::string fromPath = source;
      fromPath += "/";
      fromPath += dir.GetFile(fileNum);
      std::string toPath = destination;
      toPath += "/";
      toPath += dir.GetFile(fileNum);
      if(!this->Install(fromPath.c_str(), toPath.c_str()))
        {
        return false;
        }
      }
    }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}